

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void * canvas_undo_set_paste(_glist *x,int numpasted,int duplicate,int d_offset)

{
  t_selection *ptVar1;
  int iVar2;
  int *piVar3;
  _binbuf *p_Var4;
  
  piVar3 = (int *)getbytes(0x18);
  iVar2 = glist_getindex(x,(t_gobj *)0x0);
  *piVar3 = iVar2 - numpasted;
  iVar2 = -1;
  if (((duplicate == 0) && (ptVar1 = x->gl_editor->e_selection, ptVar1 != (t_selection *)0x0)) &&
     (ptVar1->sel_next == (_selection *)0x0)) {
    iVar2 = glist_getindex(x,ptVar1->sel_what);
  }
  piVar3[1] = iVar2;
  piVar3[2] = d_offset;
  p_Var4 = binbuf_duplicate(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
  *(_binbuf **)(piVar3 + 4) = p_Var4;
  return piVar3;
}

Assistant:

void *canvas_undo_set_paste(t_canvas *x, int numpasted, int duplicate,
    int d_offset)
{
    t_undo_paste *buf =  (t_undo_paste *)getbytes(sizeof(*buf));
    buf->u_index = glist_getindex(x, 0) - numpasted; /* do we need numpasted at all? */
    if (!duplicate && x->gl_editor->e_selection &&
        !x->gl_editor->e_selection->sel_next)
    {
            /* if only one object is selected which will warrant autopatching */
        buf->u_sel_index = glist_getindex(x,
            x->gl_editor->e_selection->sel_what);
    }
    else
    {
        buf->u_sel_index = -1;
    }
    buf->u_offset = d_offset;
    buf->u_objectbuf = binbuf_duplicate(EDITOR->copy_binbuf);
    return (buf);
}